

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::GetDefiningBlocks(LCSSARewriter *this,uint32_t bb_id)

{
  int iVar1;
  _Hash_node_base _Var2;
  DominatorTree *this_00;
  Instruction *pIVar3;
  iterator iVar4;
  uint32_t *puVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  uint32_t a;
  uint uVar9;
  mapped_type *ppBVar10;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar11;
  uint *__args;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  uint32_t *puVar16;
  __node_base *p_Var17;
  uint32_t pred_id;
  undefined8 local_38;
  
  local_38 = CONCAT44(bb_id,bb_id);
  ppBVar10 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->cfg_->id2block_,(key_type *)&local_38);
  if (*ppBVar10 == (mapped_type)0x0) {
    __assert_fail("cfg_->block(bb_id) != nullptr && \"Unknown basic block\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xdb,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->bb_to_defining_blocks_,(key_type *)((long)&local_38 + 4));
  if (*(long *)(this_01 + 8) != *(long *)this_01) {
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
  }
  p_Var17 = &(this->exit_bb_->_M_h)._M_before_begin;
  do {
    p_Var17 = p_Var17->_M_nxt;
    if (p_Var17 == (__node_base *)0x0) break;
    _Var2._M_nxt = p_Var17[1]._M_nxt;
    this_00 = this->dom_tree_;
    pIVar3 = (Instruction *)_Var2._M_nxt[1]._M_nxt;
    a = 0;
    if (pIVar3->has_result_id_ == true) {
      a = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
    }
    bVar8 = DominatorTree::Dominates(this_00,a,local_38._4_4_);
    if (bVar8) {
      pIVar3 = (Instruction *)_Var2._M_nxt[1]._M_nxt;
      uVar9 = 0;
      if (pIVar3->has_result_id_ == true) {
        uVar9 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
      }
      local_38 = CONCAT44(local_38._4_4_,uVar9);
      iVar4._M_current = *(uint **)(this_01 + 8);
      if (iVar4._M_current == *(uint **)(this_01 + 0x10)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,iVar4,
                   (uint *)&local_38);
      }
      else {
        *iVar4._M_current = uVar9;
        *(uint **)(this_01 + 8) = iVar4._M_current + 1;
      }
    }
  } while (!bVar8);
  if (p_Var17 != (__node_base *)0x0) {
    return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
  }
  pvVar11 = CFG::preds(this->cfg_,local_38._4_4_);
  puVar5 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar16 = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start; puVar16 != puVar5; puVar16 = puVar16 + 1) {
    local_38._4_4_ = (uint32_t)((ulong)local_38 >> 0x20);
    local_38 = CONCAT44(local_38._4_4_,*puVar16);
    pvVar11 = GetDefiningBlocks(this,*puVar16);
    __args = (pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4._M_current = *(uint **)(this_01 + 8);
    if ((long)(pvVar11->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__args == 4) {
      if (iVar4._M_current == *(uint **)(this_01 + 0x10)) goto LAB_005b841a;
      uVar9 = *__args;
LAB_005b8403:
      *iVar4._M_current = uVar9;
      *(uint **)(this_01 + 8) = iVar4._M_current + 1;
    }
    else {
      __args = (uint *)&local_38;
      if (iVar4._M_current != *(uint **)(this_01 + 0x10)) {
        uVar9 = (uint)local_38;
        goto LAB_005b8403;
      }
LAB_005b841a:
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this_01,iVar4,__args);
    }
  }
  piVar6 = *(int **)this_01;
  piVar7 = *(int **)(this_01 + 8);
  uVar13 = (long)piVar7 - (long)piVar6;
  if (uVar13 == 0) {
    __assert_fail("defining_blocks.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp"
                  ,0xf2,
                  "const std::vector<uint32_t> &spvtools::opt::(anonymous namespace)::LCSSARewriter::GetDefiningBlocks(uint32_t)"
                 );
  }
  piVar12 = piVar6;
  if (0 < (long)uVar13 >> 4) {
    iVar1 = *piVar6;
    piVar12 = (int *)((uVar13 & 0xfffffffffffffff0) + (long)piVar6);
    lVar15 = ((long)uVar13 >> 4) + 1;
    piVar14 = piVar6 + 2;
    do {
      if (iVar1 != piVar14[-2]) {
        piVar14 = piVar14 + -2;
        goto LAB_005b84d2;
      }
      if (iVar1 != piVar14[-1]) {
        piVar14 = piVar14 + -1;
        goto LAB_005b84d2;
      }
      if (iVar1 != *piVar14) goto LAB_005b84d2;
      if (iVar1 != piVar14[1]) {
        piVar14 = piVar14 + 1;
        goto LAB_005b84d2;
      }
      lVar15 = lVar15 + -1;
      piVar14 = piVar14 + 4;
    } while (1 < lVar15);
  }
  lVar15 = (long)piVar7 - (long)piVar12 >> 2;
  if (lVar15 != 1) {
    if (lVar15 != 2) {
      piVar14 = piVar7;
      if ((lVar15 != 3) || (piVar14 = piVar12, *piVar6 != *piVar12)) goto LAB_005b84d2;
      piVar12 = piVar12 + 1;
    }
    piVar14 = piVar12;
    if (*piVar6 != *piVar12) goto LAB_005b84d2;
    piVar12 = piVar12 + 1;
  }
  piVar14 = piVar12;
  if (*piVar6 == *piVar12) {
    piVar14 = piVar7;
  }
LAB_005b84d2:
  if (piVar14 == piVar7) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,1);
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01;
}

Assistant:

const std::vector<uint32_t>& GetDefiningBlocks(uint32_t bb_id) {
    assert(cfg_->block(bb_id) != nullptr && "Unknown basic block");
    std::vector<uint32_t>& defining_blocks = bb_to_defining_blocks_[bb_id];

    if (defining_blocks.size()) return defining_blocks;

    // Check if one of the loop exit basic block dominates |bb_id|.
    for (const BasicBlock* e_bb : exit_bb_) {
      if (dom_tree_.Dominates(e_bb->id(), bb_id)) {
        defining_blocks.push_back(e_bb->id());
        return defining_blocks;
      }
    }

    // Process parents, they will returns their suitable blocks.
    // If they are all the same, this means this basic block is dominated by a
    // common block, so we won't need to build a phi instruction.
    for (uint32_t pred_id : cfg_->preds(bb_id)) {
      const std::vector<uint32_t>& pred_blocks = GetDefiningBlocks(pred_id);
      if (pred_blocks.size() == 1)
        defining_blocks.push_back(pred_blocks[0]);
      else
        defining_blocks.push_back(pred_id);
    }
    assert(defining_blocks.size());
    if (std::all_of(defining_blocks.begin(), defining_blocks.end(),
                    [&defining_blocks](uint32_t id) {
                      return id == defining_blocks[0];
                    })) {
      // No need for a phi.
      defining_blocks.resize(1);
    }

    return defining_blocks;
  }